

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_solver.cpp
# Opt level: O0

vector<Item_*,_std::allocator<Item_*>_> * __thiscall
WorldSolver::missing_items_to_take_path
          (vector<Item_*,_std::allocator<Item_*>_> *__return_storage_ptr__,WorldSolver *this,
          WorldPath *path)

{
  pointer this_00;
  bool bVar1;
  reference ppIVar2;
  const_iterator local_a0;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_98 [3];
  Item **local_80;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_78;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_70;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> it;
  Item *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Item_*,_std::allocator<Item_*>_> *__range1;
  undefined1 local_40 [8];
  vector<Item_*,_std::allocator<Item_*>_> inventory_copy;
  vector<Item_*,_std::allocator<Item_*>_> *required_items;
  WorldPath *path_local;
  WorldSolver *this_local;
  vector<Item_*,_std::allocator<Item_*>_> *missing_items;
  
  inventory_copy.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)WorldPath::required_items(path);
  std::vector<Item_*,_std::allocator<Item_*>_>::vector
            ((vector<Item_*,_std::allocator<Item_*>_> *)local_40,&this->_inventory);
  std::vector<Item_*,_std::allocator<Item_*>_>::vector(__return_storage_ptr__);
  this_00 = inventory_copy.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end1 = std::vector<Item_*,_std::allocator<Item_*>_>::begin
                     ((vector<Item_*,_std::allocator<Item_*>_> *)
                      inventory_copy.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  item = (Item *)std::vector<Item_*,_std::allocator<Item_*>_>::end
                           ((vector<Item_*,_std::allocator<Item_*>_> *)this_00);
  while (bVar1 = __gnu_cxx::operator==<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                           (&__end1,(__normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                     *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
              operator*(&__end1);
    it._M_current = (Item **)*ppIVar2;
    local_78._M_current =
         (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::begin
                            ((vector<Item_*,_std::allocator<Item_*>_> *)local_40);
    local_80 = (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::end
                                  ((vector<Item_*,_std::allocator<Item_*>_> *)local_40);
    local_70 = std::
               find<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,Item*>
                         (local_78,(__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                    )local_80,(Item **)&it);
    local_98[0]._M_current =
         (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::end
                            ((vector<Item_*,_std::allocator<Item_*>_> *)local_40);
    bVar1 = __gnu_cxx::operator==<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                      (&local_70,local_98);
    if (bVar1) {
      std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                ((vector<Item*,std::allocator<Item*>> *)__return_storage_ptr__,(Item **)&it);
    }
    else {
      __gnu_cxx::__normal_iterator<Item*const*,std::vector<Item*,std::allocator<Item*>>>::
      __normal_iterator<Item**>
                ((__normal_iterator<Item*const*,std::vector<Item*,std::allocator<Item*>>> *)
                 &local_a0,&local_70);
      std::vector<Item_*,_std::allocator<Item_*>_>::erase
                ((vector<Item_*,_std::allocator<Item_*>_> *)local_40,local_a0);
    }
    __gnu_cxx::__normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
    operator++(&__end1);
  }
  std::vector<Item_*,_std::allocator<Item_*>_>::~vector
            ((vector<Item_*,_std::allocator<Item_*>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Item*> WorldSolver::missing_items_to_take_path(WorldPath* path) const
{
    const std::vector<Item*>& required_items = path->required_items();
    std::vector<Item*> inventory_copy = _inventory;

    std::vector<Item*> missing_items;
    for (Item* item : required_items)
    {
        auto it = std::find(inventory_copy.begin(), inventory_copy.end(), item);

        // Item could not be found in inventory, path cannot be taken
        if (it == inventory_copy.end())
        {
            missing_items.emplace_back(item);
        }
        else
        {
            // Item has been found, remove it from the inventory copy for it not to count several times
            // (case where quantity needed is > 1)
            inventory_copy.erase(it);
        }
    }

    return missing_items;
}